

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralCovarianceBase.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<32,_151>::
GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited>
::GeneralCovarianceBase
          (GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited>
           *this,GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited>
                 *param_1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer pSVar4;
  pointer pvVar5;
  undefined4 uVar6;
  
  dVar1 = param_1->spi_;
  dVar2 = param_1->ap_;
  uVar6 = *(undefined4 *)&param_1->field_0x14;
  dVar3 = param_1->awri_;
  this->nls_ = param_1->nls_;
  *(undefined4 *)&this->field_0x14 = uVar6;
  this->awri_ = dVar3;
  this->spi_ = dVar1;
  this->ap_ = dVar2;
  std::
  _Optional_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_false,_false>
  ::_Optional_base(&(this->dap_).
                    super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_false,_false>
                   ,&(param_1->dap_).
                     super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_false,_false>
                  );
  pSVar4 = (param_1->short_).
           super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->short_).
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->short_).
       super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->short_).
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar4;
  (this->short_).
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->short_).
       super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->short_).
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->short_).
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->short_).
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::ShortRangeRMatrixLimitedBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar5 = (param_1->long_).
           super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->long_).
  super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->long_).
       super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->long_).
  super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar5;
  (this->long_).
  super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->long_).
       super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->long_).
  super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->long_).
  super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->long_).
  super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT GeneralCovarianceBase {

  /* fields */
  double spi_;
  double ap_;
  unsigned int nls_;
  double awri_;
  std::optional< RadiusUncertainty > dap_;

  std::vector< ShortRangeCovarianceBlock > short_;
  std::vector< LongRangeCovarianceBlock > long_;

  /* auxiliary functions */
  #include "ENDFtk/section/32/151/GeneralCovarianceBase/src/readSequence.hpp"
  #include "ENDFtk/section/32/151/GeneralCovarianceBase/src/verifySize.hpp"

protected:

  /* constructor */
  #include "ENDFtk/section/32/151/GeneralCovarianceBase/src/ctor.hpp"

public:

  /* get methods */

  /**
   *  @brief Return the covariance representation type
   */
  static constexpr int LCOMP() { return 1; }

  /**
   *  @brief Return the covariance representation type
   */
  constexpr int covarianceRepresentation() const { return this->LCOMP(); }

  /**
   *  @brief Return the resonance type (resolved or unresolved)
   */
  constexpr int LRU() const {

    return static_cast< const Derived* >( this )->type();
  }

  /**
   *  @brief Return the resonance representation
   */
  constexpr int LRF() const {

    return static_cast< const Derived* >( this )->representation();
  }

  /**
   *  @brief Return the average fission flag
   */
  static constexpr bool LFW() { return false; }

  /**
  *  @brief Return the average fission flag
  */
  constexpr bool averageFissionWidthFlag() const {

    return this->LFW();
  }

  /**
   *  @brief Return the target spin
   */
  double SPI() const { return this->spi_; }

  /**
   *  @brief Return the target spin
   */
  double spin() const { return this->SPI(); }

  /**
   *  @brief Return the scattering radius
   */
  double AP() const { return this->ap_; }

  /**
   *  @brief Return the scattering radius
   */
  double scatteringRadius() const { return this->AP(); }

  /**
   *  @brief Return the number of l values for which resonance parameters are
   *         given
   */
  unsigned int NLS() const { return this->nls_; }

  /**
   *  @brief Return the number of l values for which resonance parameters are
   *         given
   */
  unsigned int numberLValues() const { return this->NLS(); }

  /**
   *  @brief Return the scattering radius uncertainty
   */
  const std::optional< RadiusUncertainty >& DAP() const { return this->dap_; }

  /**
   *  @brief Return the scattering radius uncertainty
   */
  const std::optional< RadiusUncertainty >& scatteringRadiusUncertainty() const {

    return this->DAP();
  }

  /**
   *  @brief Return the atomic weight ratio of the current isotope to the
   *         neutron mass
   */
  double AWRI() const { return this->awri_; }

  /**
   *  @brief Return the atomic weight ratio of the current isotope to the
   *         neutron mass
   */
  double atomicWeightRatio() const { return this->AWRI(); }

  /**
   *  @brief Return the number of short range covariance blocks
   */
  int NSRS() const { return this->short_.size(); }

  /**
   *  @brief Return the number of short range covariance blocks
   */
  int numberShortRangeBlocks() const { return this->NSRS(); }

  /**
   *  @brief Return the number of long range covariance blocks
   */
  int NLRS() const { return this->long_.size(); }

  /**
   *  @brief Return the number of short range covariance blocks
   */
  int numberLongRangeBlocks() const { return this->NLRS(); }

  /**
   *  @brief Return the scattering radius uncertainty flag
   */
  bool ISR() const { return bool( this->dap_ ); }

  /**
   *  @brief Return the angular distribution flag
   */
  bool scatteringRadiusUncertaintyFlag() const { return this->ISR(); }

  /**
   *  @brief Return the short range resonance covariance blocks
   */
  auto shortRangeBlocks() const {

    return ranges::cpp20::views::all( this->short_ );
  }

  /**
   *  @brief Return the long range resonance covariance blocks
   */
  auto longRangeBlocks() const {

    return ranges::cpp20::views::all( this->long_ );
  }

  #include "ENDFtk/section/32/151/GeneralCovarianceBase/src/NC.hpp"
  #include "ENDFtk/section/32/151/GeneralCovarianceBase/src/print.hpp"
}